

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::LayoutBindingBaseCase::iterate(LayoutBindingBaseCase *this)

{
  char *pcVar1;
  TestLog *pTVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  TestContext *pTVar6;
  MessageBuilder *pMVar7;
  undefined4 extraout_var;
  mapped_type *pmVar8;
  reference pLVar9;
  undefined4 extraout_var_00;
  char *local_848;
  code *local_7b8;
  MessageBuilder local_738;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  LogSection local_568;
  String local_528;
  MessageBuilder local_508;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  LogSection local_338;
  undefined1 local_2f8 [8];
  LayoutBindingTestResult result;
  String local_2c8;
  key_type local_2a4;
  String local_2a0;
  key_type local_27c;
  String local_278;
  __normal_iterator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest_*,_std::vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>_>
  local_258;
  __normal_iterator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest_*,_std::vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>_>
  local_250;
  iterator it;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_89;
  string local_88;
  LogSection local_68;
  byte local_21;
  TestLog *pTStack_20;
  bool passed;
  TestLog *log;
  LayoutBindingBaseCase *this_local;
  
  log = (TestLog *)this;
  pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTStack_20 = tcu::TestContext::getLog(pTVar6);
  local_21 = 1;
  uVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x22])();
  pTVar2 = pTStack_20;
  if ((uVar4 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"NotSupported",&local_89)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
    tcu::LogSection::LogSection(&local_68,&local_88,&local_c0);
    tcu::TestLog::operator<<(pTVar2,&local_68);
    tcu::LogSection::~LogSection(&local_68);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&it,pTStack_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&it,
                        (char (*) [60])"This test was not run as minimum requirements were not met."
                       );
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&it);
    tcu::TestLog::operator<<(pTStack_20,(EndSectionToken *)&tcu::TestLog::EndSection);
    iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])();
    pTVar6 = deqp::Context::getTestContext((Context *)CONCAT44(extraout_var,iVar5));
    tcu::TestContext::setTestResult(pTVar6,QP_TEST_RESULT_NOT_SUPPORTED,"NotSupported");
  }
  else {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[2])();
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x27])();
    local_250._M_current =
         (LayoutBindingSubTest *)
         std::
         vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
         ::begin(&this->m_tests);
    while( true ) {
      local_258._M_current =
           (LayoutBindingSubTest *)
           std::
           vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>
           ::end(&this->m_tests);
      bVar3 = __gnu_cxx::operator!=(&local_250,&local_258);
      if (!bVar3) break;
      initDefaultVSContext_abi_cxx11_(&local_278,this);
      local_27c = VertexShader;
      pmVar8 = std::
               map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->m_sources,&local_27c);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      initDefaultFSContext_abi_cxx11_(&local_2a0,this);
      local_2a4 = FragmentShader;
      pmVar8 = std::
               map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->m_sources,&local_2a4);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      initDefaultCSContext_abi_cxx11_(&local_2c8,this);
      result.m_reason.field_2._12_4_ = 2;
      pmVar8 = std::
               map<glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->m_sources,
                            (key_type *)(result.m_reason.field_2._M_local_buf + 0xc));
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      pLVar9 = __gnu_cxx::
               __normal_iterator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest_*,_std::vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>_>
               ::operator*(&local_250);
      local_7b8 = (code *)pLVar9->test;
      if (((ulong)local_7b8 & 1) != 0) {
        local_7b8 = *(code **)(local_7b8 +
                              *(long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode.
                                               _vptr_TestNode + *(long *)&pLVar9->field_0x18) + -1);
      }
      (*local_7b8)();
      bVar3 = LayoutBindingTestResult::testPassed((LayoutBindingTestResult *)local_2f8);
      pTVar2 = pTStack_20;
      if (!bVar3) {
        pLVar9 = __gnu_cxx::
                 __normal_iterator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest_*,_std::vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>_>
                 ::operator*(&local_250);
        pcVar1 = pLVar9->name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,pcVar1,&local_359);
        pLVar9 = __gnu_cxx::
                 __normal_iterator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest_*,_std::vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>_>
                 ::operator*(&local_250);
        pcVar1 = pLVar9->description;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,pcVar1,&local_381);
        tcu::LogSection::LogSection(&local_338,&local_358,&local_380);
        tcu::TestLog::operator<<(pTVar2,&local_338);
        tcu::LogSection::~LogSection(&local_338);
        std::__cxx11::string::~string((string *)&local_380);
        std::allocator<char>::~allocator(&local_381);
        std::__cxx11::string::~string((string *)&local_358);
        std::allocator<char>::~allocator(&local_359);
        tcu::TestLog::operator<<(&local_508,pTStack_20,(BeginMessageToken *)&tcu::TestLog::Message);
        LayoutBindingTestResult::getReason_abi_cxx11_
                  (&local_528,(LayoutBindingTestResult *)local_2f8);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_508,&local_528);
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_528);
        tcu::MessageBuilder::~MessageBuilder(&local_508);
        tcu::TestLog::operator<<(pTStack_20,(EndSectionToken *)&tcu::TestLog::EndSection);
      }
      bVar3 = LayoutBindingTestResult::runForThisContext((LayoutBindingTestResult *)local_2f8);
      pTVar2 = pTStack_20;
      if (!bVar3) {
        pLVar9 = __gnu_cxx::
                 __normal_iterator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest_*,_std::vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>_>
                 ::operator*(&local_250);
        pcVar1 = pLVar9->name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,pcVar1,&local_589);
        pLVar9 = __gnu_cxx::
                 __normal_iterator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest_*,_std::vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>_>
                 ::operator*(&local_250);
        pcVar1 = pLVar9->description;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,pcVar1,&local_5b1);
        tcu::LogSection::LogSection(&local_568,&local_588,&local_5b0);
        tcu::TestLog::operator<<(pTVar2,&local_568);
        tcu::LogSection::~LogSection(&local_568);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::allocator<char>::~allocator(&local_5b1);
        std::__cxx11::string::~string((string *)&local_588);
        std::allocator<char>::~allocator(&local_589);
        tcu::TestLog::operator<<(&local_738,pTStack_20,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_738,
                            (char (*) [61])
                            "This test was not run for this context as it does not apply.");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_738);
        tcu::TestLog::operator<<(pTStack_20,(EndSectionToken *)&tcu::TestLog::EndSection);
      }
      bVar3 = LayoutBindingTestResult::testPassed((LayoutBindingTestResult *)local_2f8);
      local_21 = (local_21 & 1 & bVar3) != 0;
      LayoutBindingTestResult::~LayoutBindingTestResult((LayoutBindingTestResult *)local_2f8);
      __gnu_cxx::
      __normal_iterator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest_*,_std::vector<glcts::LayoutBindingBaseCase::LayoutBindingSubTest,_std::allocator<glcts::LayoutBindingBaseCase::LayoutBindingSubTest>_>_>
      ::operator++(&local_250,0);
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x28])();
    iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])();
    pTVar6 = deqp::Context::getTestContext((Context *)CONCAT44(extraout_var_00,iVar5));
    if ((local_21 & 1) == 0) {
      local_848 = "Fail";
    }
    else {
      local_848 = "Pass";
    }
    tcu::TestContext::setTestResult(pTVar6,(uint)((local_21 & 1) == 0),local_848);
  }
  return STOP;
}

Assistant:

LayoutBindingBaseCase::IterateResult LayoutBindingBaseCase::iterate(void)
{
	tcu::TestLog& log	= m_context.getTestContext().getLog();
	bool		  passed = true;

	if (!isSupported())
	{
		log << tcu::TestLog::Section("NotSupported", "");
		log << tcu::TestLog::Message << "This test was not run as minimum requirements were not met."
			<< tcu::TestLog::EndMessage;
		log << tcu::TestLog::EndSection;
		getContext().getTestContext().setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "NotSupported");
		return STOP;
	}

	// init test case (create shader templates and textures)
	init();

	// allocate resources for all subtests
	setupTest();

	for (std::vector<LayoutBindingSubTest>::iterator it = m_tests.begin(); it != m_tests.end(); it++)
	{
		// need to reset templates and their args to a clean state before every
		// test to avoid bleeding.
		m_sources[VertexShader]   = initDefaultVSContext();
		m_sources[FragmentShader] = initDefaultFSContext();
		m_sources[ComputeShader]  = initDefaultCSContext();

		LayoutBindingTestResult result = ((*this).*((*it).test))();
		if (!result.testPassed())
		{
			log << tcu::TestLog::Section((*it).name, (*it).description);
			log << tcu::TestLog::Message << result.getReason() << tcu::TestLog::EndMessage;
			log << tcu::TestLog::EndSection;
		}
		if (!result.runForThisContext())
		{
			log << tcu::TestLog::Section((*it).name, (*it).description);
			log << tcu::TestLog::Message << "This test was not run for this context as it does not apply."
				<< tcu::TestLog::EndMessage;
			log << tcu::TestLog::EndSection;
		}
		passed &= result.testPassed();
	}

	// cleanup resources
	teardownTest();

	/*=========================================================================
	 TEST results
	 =========================================================================*/

	getContext().getTestContext().setTestResult(passed ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
												passed ? "Pass" : "Fail");

	return STOP;
}